

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O2

void __thiscall
MxxColl_ScattervConvenience_Test::~MxxColl_ScattervConvenience_Test
          (MxxColl_ScattervConvenience_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxColl, ScattervConvenience) {
    mxx::comm c = MPI_COMM_WORLD;

    std::vector<int> vec;
    std::vector<size_t> sizes;

    // scatter from 0
    if (c.rank() == 0) {
        sizes.resize(c.size());
        for (int i = 0; i < c.size(); ++i) {
            sizes[i] = i+1;
            for (size_t j = 0; j < (size_t)(i+1); ++j)
            {
                vec.push_back(13*j + -23*i);
            }
        }
    }

    // test general case with recv
    std::vector<int> result(c.rank()+1);
    if (c.rank() == 0)
        mxx::scatterv(&vec[0], sizes, &result.front(), c.rank()+1, 0, c);
    else
        result = mxx::scatterv_recv<int>(c.rank()+1, 0, MPI_COMM_WORLD);
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j+-23*c.rank(), result[j]);
    }

    // test convenience functions
    result = mxx::scatterv(&vec[0], sizes, c.rank()+1, 0, c);
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }
    if (c.rank() == 0)
        result = mxx::scatterv(&vec[0], sizes, c.rank()+1, 0, c);
    else {
        result.resize(c.rank() + 1);
        mxx::scatterv_recv(&result.front(), c.rank()+1, 0);
    }
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }

    // test convenience functions
    result = mxx::scatterv(vec, sizes, c.rank()+1, 0, c);
    ASSERT_EQ(c.rank()+1, (int)result.size());
    for (int j = 0; j < (int)result.size(); ++j) {
        ASSERT_EQ(13*j-23*c.rank(), result[j]);
    }
}